

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_model.cc
# Opt level: O2

EncodeResult * __thiscall
sentencepiece::word::Model::Encode
          (EncodeResult *__return_storage_ptr__,Model *this,string_view normalized)

{
  undefined1 in_R9B;
  basic_string_view<char,_std::char_traits<char>_> *w;
  string_view text;
  int local_44;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_40;
  
  (*(this->super_ModelInterface)._vptr_ModelInterface[2])(&local_40);
  if (local_40._M_impl.super__Vector_impl_data._M_start ==
      (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
    util::Status::~Status((Status *)&local_40);
    if ((sentencepiece *)normalized._M_len != (sentencepiece *)0x0) {
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      text._M_str = (char *)0x0;
      text._M_len = (size_t)normalized._M_str;
      SplitIntoWords((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)&local_40,(sentencepiece *)normalized._M_len,text,false,(bool)in_R9B);
      for (; local_40._M_impl.super__Vector_impl_data._M_start !=
             local_40._M_impl.super__Vector_impl_data._M_finish;
          local_40._M_impl.super__Vector_impl_data._M_start =
               local_40._M_impl.super__Vector_impl_data._M_start + 1) {
        local_44 = (*(this->super_ModelInterface)._vptr_ModelInterface[0xe])
                             (this,(local_40._M_impl.super__Vector_impl_data._M_start)->_M_len,
                              (local_40._M_impl.super__Vector_impl_data._M_start)->_M_str);
        std::
        vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
        ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int>
                  ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
                    *)__return_storage_ptr__,local_40._M_impl.super__Vector_impl_data._M_start,
                   &local_44);
      }
      std::
      _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Vector_base(&local_40);
      return __return_storage_ptr__;
    }
  }
  else {
    util::Status::~Status((Status *)&local_40);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

EncodeResult Model::Encode(absl::string_view normalized) const {
  if (!status().ok() || normalized.empty()) {
    return {};
  }

  EncodeResult output;
  for (const auto &w : SplitIntoWords(normalized)) {
    output.emplace_back(w, PieceToId(w));
  }

  return output;
}